

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O1

Gia_Man_t *
Abc_NtkFinMiterToGia
          (Abc_Ntk_t *pNtk,Vec_Int_t *vTypes,Vec_Int_t *vCos,Vec_Int_t *vCis,Vec_Int_t *vNodes,
          int *iObjs,int *Types,Vec_Int_t *vLits)

{
  char *pcVar1;
  Abc_Obj_t *pAVar2;
  Gia_Obj_t *pGVar3;
  void *pvVar4;
  int iVar5;
  Vec_Int_t *vTemp;
  int *piVar6;
  Gia_Man_t *p;
  size_t sVar7;
  char *pcVar8;
  Gia_Obj_t *pGVar9;
  ulong uVar10;
  Gia_Man_t *pGVar11;
  long lVar12;
  int n;
  long lVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  
  vTemp = (Vec_Int_t *)malloc(0x10);
  vTemp->nCap = 100;
  vTemp->nSize = 0;
  piVar6 = (int *)malloc(400);
  vTemp->pArray = piVar6;
  p = Gia_ManStart(1000);
  pcVar1 = pNtk->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar1);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar1);
  }
  p->pName = pcVar8;
  pcVar1 = pNtk->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar1);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar1);
  }
  p->pSpec = pcVar8;
  Gia_ManHashStart(p);
  if (0 < vCis->nSize) {
    lVar12 = 0;
    do {
      iVar17 = vCis->pArray[lVar12];
      if (((long)iVar17 < 0) || (pNtk->vObjs->nSize <= iVar17)) goto LAB_002b223e;
      pAVar2 = (Abc_Obj_t *)pNtk->vObjs->pArray[iVar17];
      if (pAVar2 != (Abc_Obj_t *)0x0) {
        pGVar9 = Gia_ManAppendObj(p);
        uVar18 = *(ulong *)pGVar9;
        *(ulong *)pGVar9 = uVar18 | 0x9fffffff;
        *(ulong *)pGVar9 =
             uVar18 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20
        ;
        pGVar3 = p->pObjs;
        if ((pGVar9 < pGVar3) || (pGVar3 + p->nObjs <= pGVar9)) goto LAB_002b225d;
        Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar3) >> 2) * -0x55555555);
        pGVar3 = p->pObjs;
        if ((pGVar9 < pGVar3) || (pGVar3 + p->nObjs <= pGVar9)) goto LAB_002b225d;
        iVar17 = (int)((ulong)((long)pGVar9 - (long)pGVar3) >> 2) * 0x55555556;
        lVar13 = 0;
        do {
          uVar15 = pAVar2->Id;
          if (iObjs[lVar13] == uVar15) {
            if (Types[lVar13] == -0x61) {
              if ((int)uVar15 < 0) goto LAB_002b21e1;
              iVar5 = iVar17 + 1;
              if (iVar17 < 0) goto LAB_002b221f;
            }
            else {
              if ((int)uVar15 < 0) goto LAB_002b21e1;
              iVar5 = Abc_NtkFinSimOneLit(p,pAVar2,Types[lVar13],vLits,(int)lVar13,vTemp);
            }
            uVar15 = (int)lVar13 + uVar15 * 2;
            uVar18 = (ulong)uVar15;
            if (vLits->nSize <= (int)uVar15) goto LAB_002b2200;
          }
          else {
            if ((int)uVar15 < 0) goto LAB_002b21e1;
            uVar18 = lVar13 + (ulong)uVar15 * 2;
            iVar5 = iVar17;
            if (vLits->nSize <= (int)uVar18) goto LAB_002b2200;
          }
          vLits->pArray[uVar18 & 0xffffffff] = iVar5;
          lVar13 = lVar13 + 1;
        } while (lVar13 == 1);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < vCis->nSize);
  }
  if (0 < vNodes->nSize) {
    lVar12 = 0;
    do {
      iVar17 = vNodes->pArray[lVar12];
      if (((long)iVar17 < 0) || (pNtk->vObjs->nSize <= iVar17)) goto LAB_002b223e;
      pAVar2 = (Abc_Obj_t *)pNtk->vObjs->pArray[iVar17];
      if (pAVar2 != (Abc_Obj_t *)0x0) {
        if ((pNtk->ntkFunc == ABC_FUNC_MAP) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
          iVar17 = Mio_GateReadCell((Mio_Gate_t *)(pAVar2->field_5).pData);
        }
        else {
          iVar17 = pAVar2->Id;
          if (((long)iVar17 < 0) || (vTypes->nSize <= iVar17)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar17 = vTypes->pArray[iVar17];
        }
        lVar13 = 0;
        do {
          iVar5 = pAVar2->Id;
          n = (int)lVar13;
          if (iObjs[lVar13] == iVar5) {
            if (Types[lVar13] != -0x61) {
              if (-1 < iVar5) {
                uVar18 = (ulong)(uint)(n + iVar5 * 2);
                iVar5 = Types[lVar13];
                goto LAB_002b1f64;
              }
              goto LAB_002b21e1;
            }
            if (iVar5 < 0) goto LAB_002b21e1;
            uVar15 = Abc_NtkFinSimOneLit(p,pAVar2,iVar17,vLits,n,vTemp);
            if ((int)uVar15 < 0) {
LAB_002b221f:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x131,"int Abc_LitNot(int)");
            }
            if (vLits->nSize <= iVar5 * 2 + n) {
LAB_002b2200:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            uVar18 = (ulong)(uint)(n + iVar5 * 2);
            uVar15 = uVar15 ^ 1;
          }
          else {
            if (iVar5 < 0) goto LAB_002b21e1;
            uVar18 = (ulong)(uint)(iVar5 * 2) + lVar13;
            iVar5 = iVar17;
LAB_002b1f64:
            uVar15 = Abc_NtkFinSimOneLit(p,pAVar2,iVar5,vLits,n,vTemp);
            if (vLits->nSize <= (int)uVar18) goto LAB_002b2200;
          }
          vLits->pArray[uVar18 & 0xffffffff] = uVar15;
          lVar13 = lVar13 + 1;
        } while (lVar13 == 1);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < vNodes->nSize);
  }
  if (vCos->nSize < 1) {
    uVar15 = 0;
  }
  else {
    lVar12 = 0;
    uVar15 = 0;
    do {
      iVar17 = vCos->pArray[lVar12];
      if (((long)iVar17 < 0) || (pNtk->vObjs->nSize <= iVar17)) {
LAB_002b223e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar4 = pNtk->vObjs->pArray[iVar17];
      if (pvVar4 != (void *)0x0) {
        uVar14 = **(uint **)((long)pvVar4 + 0x20);
        if ((int)uVar14 < 0) {
LAB_002b21e1:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        if (vLits->nSize <= (int)(uVar14 * 2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        iVar17 = Gia_ManHashXor(p,vLits->pArray[(ulong)uVar14 * 2],
                                vLits->pArray[(ulong)uVar14 * 2 + 1]);
        uVar15 = Gia_ManHashOr(p,uVar15,iVar17);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < vCos->nSize);
  }
  if (((int)uVar15 < 0) || (uVar14 = uVar15 >> 1, p->nObjs <= (int)uVar14)) {
    __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x314,"int Gia_ManAppendCo(Gia_Man_t *, int)");
  }
  if ((~*(uint *)(p->pObjs + uVar14) & 0x1fffffff) != 0 && (int)*(uint *)(p->pObjs + uVar14) < 0) {
    __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
  }
  pGVar9 = Gia_ManAppendObj(p);
  uVar18 = *(ulong *)pGVar9;
  *(ulong *)pGVar9 = uVar18 | 0x80000000;
  pGVar3 = p->pObjs;
  if ((pGVar3 <= pGVar9) && (pGVar9 < pGVar3 + p->nObjs)) {
    uVar10 = (ulong)(((uint)((int)pGVar9 - (int)pGVar3) >> 2) * -0x55555555 - uVar14 & 0x1fffffff);
    uVar16 = (ulong)((uVar15 & 1) << 0x1d);
    *(ulong *)pGVar9 = uVar16 | uVar18 & 0xffffffffc0000000 | 0x80000000 | uVar10;
    *(ulong *)pGVar9 =
         uVar16 | uVar18 & 0xe0000000c0000000 | 0x80000000 | uVar10 |
         (ulong)(p->vCos->nSize & 0x1fffffff) << 0x20;
    pGVar3 = p->pObjs;
    if ((pGVar3 <= pGVar9) && (pGVar9 < pGVar3 + p->nObjs)) {
      Vec_IntPush(p->vCos,(int)((ulong)((long)pGVar9 - (long)pGVar3) >> 2) * -0x55555555);
      if (p->pFanData != (int *)0x0) {
        Gia_ObjAddFanout(p,pGVar9 + -(ulong)((uint)*(undefined8 *)pGVar9 & 0x1fffffff),pGVar9);
      }
      if ((p->pObjs <= pGVar9) && (pGVar9 < p->pObjs + p->nObjs)) {
        pGVar11 = Gia_ManCleanup(p);
        Gia_ManStop(p);
        if (vTemp->pArray != (int *)0x0) {
          free(vTemp->pArray);
          vTemp->pArray = (int *)0x0;
        }
        free(vTemp);
        return pGVar11;
      }
    }
  }
LAB_002b225d:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

Gia_Man_t * Abc_NtkFinMiterToGia( Abc_Ntk_t * pNtk, Vec_Int_t * vTypes, Vec_Int_t * vCos, Vec_Int_t * vCis, Vec_Int_t * vNodes, 
                                  int iObjs[2], int Types[2], Vec_Int_t * vLits )
{
    Gia_Man_t * pNew = NULL, * pTemp;
    Abc_Obj_t * pObj; 
    Vec_Int_t * vTemp = Vec_IntAlloc( 100 );
    int n, i, Type, iMiter, iLit, * pLits;
    // create AIG manager
    pNew = Gia_ManStart( 1000 );
    pNew->pName = Abc_UtilStrsav( pNtk->pName );
    pNew->pSpec = Abc_UtilStrsav( pNtk->pSpec );
    Gia_ManHashStart( pNew );
    // create inputs
    Abc_NtkForEachObjVec( vCis, pNtk, pObj, i )
    {
        iLit = Gia_ManAppendCi(pNew);
        for ( n = 0; n < 2; n++ )
        {
            if ( iObjs[n] != (int)Abc_ObjId(pObj) )
                Vec_IntWriteEntry( vLits, Abc_Var2Lit(Abc_ObjId(pObj), n), iLit );
            else if ( Types[n] != ABC_FIN_NEG )
                Vec_IntWriteEntry( vLits, Abc_Var2Lit(Abc_ObjId(pObj), n), Abc_NtkFinSimOneLit(pNew, pObj, Types[n], vLits, n, vTemp) );
            else // if ( iObjs[n] == (int)Abc_ObjId(pObj) && Types[n] == ABC_FIN_NEG )
                Vec_IntWriteEntry( vLits, Abc_Var2Lit(Abc_ObjId(pObj), n), Abc_LitNot(iLit) );
        }
    }
    // create internal nodes
    Abc_NtkForEachObjVec( vNodes, pNtk, pObj, i )
    {
        Type = Abc_NtkIsMappedLogic(pNtk) ? Mio_GateReadCell((Mio_Gate_t *)pObj->pData) : Vec_IntEntry(vTypes, Abc_ObjId(pObj));
        for ( n = 0; n < 2; n++ )
        {
            if ( iObjs[n] != (int)Abc_ObjId(pObj) )
                Vec_IntWriteEntry( vLits, Abc_Var2Lit(Abc_ObjId(pObj), n), Abc_NtkFinSimOneLit(pNew, pObj, Type, vLits, n, vTemp) );
            else if ( Types[n] != ABC_FIN_NEG )
                Vec_IntWriteEntry( vLits, Abc_Var2Lit(Abc_ObjId(pObj), n), Abc_NtkFinSimOneLit(pNew, pObj, Types[n], vLits, n, vTemp) );
            else // if ( iObjs[n] == (int)Abc_ObjId(pObj) && Types[n] == ABC_FIN_NEG )
                Vec_IntWriteEntry( vLits, Abc_Var2Lit(Abc_ObjId(pObj), n), Abc_LitNot(Abc_NtkFinSimOneLit(pNew, pObj, Type, vLits, n, vTemp)) );
        }
    }
    // create comparator
    iMiter = 0;
    Abc_NtkForEachObjVec( vCos, pNtk, pObj, i )
    {
        pLits  = Vec_IntEntryP( vLits, Abc_Var2Lit(Abc_ObjFaninId0(pObj), 0) );
        iLit   = Gia_ManHashXor( pNew, pLits[0], pLits[1] );
        iMiter = Gia_ManHashOr( pNew, iMiter, iLit );
    }
    Gia_ManAppendCo( pNew, iMiter );
    // perform cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    Vec_IntFree( vTemp );
    return pNew;
}